

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

TableStorageInfo * __thiscall
duckdb::DataTable::GetStorageInfo(TableStorageInfo *__return_storage_ptr__,DataTable *this)

{
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  pointer puVar1;
  int iVar2;
  RowGroupCollection *this_01;
  idx_t index;
  DataTableInfo *pDVar3;
  type pIVar4;
  pointer this_02;
  IndexInfo local_70;
  
  (__return_storage_ptr__->cardinality).index = 0xffffffffffffffff;
  (__return_storage_ptr__->index_info).
  super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
  super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->index_info).
  super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
  super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->index_info).
  super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>.
  super__Vector_base<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  index = RowGroupCollection::GetTotalRows(this_01);
  optional_idx::optional_idx((optional_idx *)&local_70,index);
  (__return_storage_ptr__->cardinality).index =
       CONCAT53(local_70._3_5_,
                CONCAT12(local_70.is_foreign,CONCAT11(local_70.is_primary,local_70.is_unique)));
  pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&pDVar3->indexes);
  if (iVar2 == 0) {
    this_02 = (pDVar3->indexes).indexes.
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (pDVar3->indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_02 != puVar1) {
      this_00 = &local_70.column_set;
      do {
        pIVar4 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                           (this_02);
        local_70.column_set._M_h._M_buckets = &local_70.column_set._M_h._M_single_bucket;
        local_70.column_set._M_h._M_bucket_count = 1;
        local_70.column_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_70.column_set._M_h._M_element_count = 0;
        local_70.column_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_70.column_set._M_h._M_rehash_policy._M_next_resize = 0;
        local_70.column_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
        iVar2 = (*pIVar4->_vptr_Index[5])(pIVar4);
        local_70.is_primary = (char)iVar2 == '\x02';
        iVar2 = (*pIVar4->_vptr_Index[5])(pIVar4);
        local_70.is_unique = local_70.is_primary;
        if ((byte)((char)iVar2 - 1U) < 2) {
          local_70.is_unique = true;
        }
        iVar2 = (*pIVar4->_vptr_Index[5])(pIVar4);
        local_70.is_foreign = (char)iVar2 == '\x03';
        if (&pIVar4->column_id_set != this_00) {
          ::std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)this_00,&(pIVar4->column_id_set)._M_h);
        }
        ::std::vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>::
        emplace_back<duckdb::IndexInfo>
                  (&(__return_storage_ptr__->index_info).
                    super_vector<duckdb::IndexInfo,_std::allocator<duckdb::IndexInfo>_>,&local_70);
        ::std::
        _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&this_00->_M_h);
        this_02 = this_02 + 1;
      } while (this_02 != puVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&pDVar3->indexes);
    return __return_storage_ptr__;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

TableStorageInfo DataTable::GetStorageInfo() {
	TableStorageInfo result;
	result.cardinality = GetTotalRows();
	info->indexes.Scan([&](Index &index) {
		IndexInfo index_info;
		index_info.is_primary = index.IsPrimary();
		index_info.is_unique = index.IsUnique() || index_info.is_primary;
		index_info.is_foreign = index.IsForeign();
		index_info.column_set = index.GetColumnIdSet();
		result.index_info.push_back(std::move(index_info));
		return false;
	});
	return result;
}